

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O2

void __thiscall spvtools::utils::BitVector::ReportDensity(BitVector *this,ostream *out)

{
  ostream *poVar1;
  ulong *puVar2;
  long lVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  uVar4 = 0;
  for (puVar2 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    for (uVar5 = *puVar2; uVar5 != 0; uVar5 = uVar5 >> 1) {
      uVar4 = uVar4 + ((uint)uVar5 & 1);
    }
  }
  poVar1 = std::operator<<(out,"count=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", total size (bytes)=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", bytes per element=");
  lVar3 = (long)(this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  std::ostream::_M_insert<double>
            (((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / (double)uVar4);
  return;
}

Assistant:

void BitVector::ReportDensity(std::ostream& out) {
  uint32_t count = 0;

  for (BitContainer e : bits_) {
    while (e != 0) {
      if ((e & 1) != 0) {
        ++count;
      }
      e = e >> 1;
    }
  }

  out << "count=" << count
      << ", total size (bytes)=" << bits_.size() * sizeof(BitContainer)
      << ", bytes per element="
      << (double)(bits_.size() * sizeof(BitContainer)) / (double)(count);
}